

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Base64.c
# Opt level: O0

WJTL_STATUS TestBase64Encode(void)

{
  undefined1 uVar1;
  JL_STATUS JVar2;
  int iVar3;
  bool bVar4;
  _Bool _result_14;
  _Bool _result_13;
  _Bool _result_12;
  char *data3Result;
  undefined1 local_448 [4];
  int i_1;
  uint8_t data3 [256];
  _Bool _result_11;
  _Bool _result_10;
  _Bool _result_9;
  char *data2Result;
  undefined1 local_328 [4];
  int i;
  uint8_t data2 [768];
  _Bool _result_8;
  _Bool _result_7;
  _Bool _result_6;
  _Bool _result_5;
  _Bool _result_4;
  _Bool _result_3;
  _Bool _result_2;
  _Bool _result_1;
  _Bool _result;
  char *string;
  uint8_t data [3];
  WJTL_STATUS TestReturn;
  
  string._4_4_ = WJTL_STATUS_SUCCESS;
  string._1_2_ = 0x201;
  string._3_1_ = 3;
  __result_7 = (char *)0x0;
  JVar2 = JlBase64Encode((void *)((long)&string + 1),1,(char **)&_result_7);
  WjTestLib_Assert(JVar2 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlBase64Encode( data, 1, &string ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x2a);
  if (JVar2 != JL_STATUS_SUCCESS) {
    string._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar4 = __result_7 != (char *)0x0;
  WjTestLib_Assert(bVar4,"(string) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x2b);
  if (!bVar4) {
    string._4_4_ = WJTL_STATUS_FAILED;
  }
  iVar3 = strcmp(__result_7,"AQ");
  WjTestLib_Assert(iVar3 == 0,"strcmp( string, \"AQ\" ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x2c);
  if (iVar3 != 0) {
    string._4_4_ = WJTL_STATUS_FAILED;
  }
  WjTestLib_Free(__result_7);
  __result_7 = (char *)0x0;
  JVar2 = JlBase64Encode((void *)((long)&string + 1),2,(char **)&_result_7);
  WjTestLib_Assert(JVar2 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlBase64Encode( data, 2, &string ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x2f);
  if (JVar2 != JL_STATUS_SUCCESS) {
    string._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar4 = __result_7 != (char *)0x0;
  WjTestLib_Assert(bVar4,"(string) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x30);
  if (!bVar4) {
    string._4_4_ = WJTL_STATUS_FAILED;
  }
  iVar3 = strcmp(__result_7,"AQI");
  WjTestLib_Assert(iVar3 == 0,"strcmp( string, \"AQI\" ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x31);
  if (iVar3 != 0) {
    string._4_4_ = WJTL_STATUS_FAILED;
  }
  WjTestLib_Free(__result_7);
  __result_7 = (char *)0x0;
  JVar2 = JlBase64Encode((void *)((long)&string + 1),3,(char **)&_result_7);
  WjTestLib_Assert(JVar2 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlBase64Encode( data, 3, &string ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x34);
  if (JVar2 != JL_STATUS_SUCCESS) {
    string._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar4 = __result_7 != (char *)0x0;
  WjTestLib_Assert(bVar4,"(string) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x35);
  if (!bVar4) {
    string._4_4_ = WJTL_STATUS_FAILED;
  }
  iVar3 = strcmp(__result_7,"AQID");
  data2[0x2ff] = iVar3 == 0;
  WjTestLib_Assert((_Bool)data2[0x2ff],"strcmp( string, \"AQID\" ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x36);
  if ((data2[0x2ff] & 1) == 0) {
    string._4_4_ = WJTL_STATUS_FAILED;
  }
  WjTestLib_Free(__result_7);
  __result_7 = (char *)0x0;
  for (data2Result._4_4_ = 0; data2Result._4_4_ < 0x100; data2Result._4_4_ = data2Result._4_4_ + 1)
  {
    uVar1 = (undefined1)data2Result._4_4_;
    local_328[data2Result._4_4_ * 3] = uVar1;
    local_328[data2Result._4_4_ * 3 + 1] = uVar1;
    local_328[data2Result._4_4_ * 3 + 2] = uVar1;
  }
  JVar2 = JlBase64Encode(local_328,0x300,(char **)&_result_7);
  WjTestLib_Assert(JVar2 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlBase64Encode( data2, sizeof(data2), &string ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x52);
  if (JVar2 != JL_STATUS_SUCCESS) {
    string._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar4 = __result_7 != (char *)0x0;
  WjTestLib_Assert(bVar4,"(string) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x53);
  if (!bVar4) {
    string._4_4_ = WJTL_STATUS_FAILED;
  }
  iVar3 = strcmp(__result_7,
                 "AAAAAQEBAgICAwMDBAQEBQUFBgYGBwcHCAgICQkJCgoKCwsLDAwMDQ0NDg4ODw8PEBAQEREREhISExMTFBQUFRUVFhYWFxcXGBgYGRkZGhoaGxsbHBwcHR0dHh4eHx8fICAgISEhIiIiIyMjJCQkJSUlJiYmJycnKCgoKSkpKioqKysrLCwsLS0tLi4uLy8vMDAwMTExMjIyMzMzNDQ0NTU1NjY2Nzc3ODg4OTk5Ojo6Ozs7PDw8PT09Pj4+Pz8/QEBAQUFBQkJCQ0NDRERERUVFRkZGR0dHSEhISUlJSkpKS0tLTExMTU1NTk5OT09PUFBQUVFRUlJSU1NTVFRUVVVVVlZWV1dXWFhYWVlZWlpaW1tbXFxcXV1dXl5eX19fYGBgYWFhYmJiY2NjZGRkZWVlZmZmZ2dnaGhoaWlpampqa2trbGxsbW1tbm5ub29vcHBwcXFxcnJyc3NzdHR0dXV1dnZ2d3d3eHh4eXl5enp6e3t7fHx8fX19fn5+f39/gICAgYGBgoKCg4ODhISEhYWFhoaGh4eHiIiIiYmJioqKi4uLjIyMjY2Njo6Oj4+PkJCQkZGRkpKSk5OTlJSUlZWVlpaWl5eXmJiYmZmZmpqam5ubnJycnZ2dnp6en5+foKCgoaGhoqKio6OjpKSkpaWlpqamp6enqKioqampqqqqq6urrKysra2trq6ur6+vsLCwsbGxsrKys7OztLS0tbW1tra2t7e3uLi4ubm5urq6u7u7vLy8vb29vr6+v7+/wMDAwcHBwsLCw8PDxMTExcXFxsbGx8fHyMjIycnJysrKy8vLzMzMzc3Nzs7Oz8/P0NDQ0dHR0tLS09PT1NTU1dXV1tbW19fX2NjY2dnZ2tra29vb3Nzc3d3d3t7e39/f4ODg4eHh4uLi4+Pj5OTk5eXl5ubm5+fn6Ojo6enp6urq6+vr7Ozs7e3t7u7u7+/v8PDw8fHx8vLy8/Pz9PT09fX19vb29/f3+Pj4+fn5+vr6+/v7/Pz8/f39/v7+////"
                );
  WjTestLib_Assert(iVar3 == 0,"strcmp( string, data2Result) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x54);
  if (iVar3 != 0) {
    string._4_4_ = WJTL_STATUS_FAILED;
  }
  WjTestLib_Free(__result_7);
  __result_7 = (char *)0x0;
  for (data3Result._4_4_ = 0; data3Result._4_4_ < 0x100; data3Result._4_4_ = data3Result._4_4_ + 1)
  {
    local_448[data3Result._4_4_] = (char)data3Result._4_4_;
  }
  JVar2 = JlBase64Encode(local_448,0x100,(char **)&_result_7);
  WjTestLib_Assert(JVar2 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlBase64Encode( data3, sizeof(data3), &string ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x65);
  if (JVar2 != JL_STATUS_SUCCESS) {
    string._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar4 = __result_7 != (char *)0x0;
  WjTestLib_Assert(bVar4,"(string) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x66);
  if (!bVar4) {
    string._4_4_ = WJTL_STATUS_FAILED;
  }
  iVar3 = strcmp(__result_7,
                 "AAECAwQFBgcICQoLDA0ODxAREhMUFRYXGBkaGxwdHh8gISIjJCUmJygpKissLS4vMDEyMzQ1Njc4OTo7PD0+P0BBQkNERUZHSElKS0xNTk9QUVJTVFVWV1hZWltcXV5fYGFiY2RlZmdoaWprbG1ub3BxcnN0dXZ3eHl6e3x9fn+AgYKDhIWGh4iJiouMjY6PkJGSk5SVlpeYmZqbnJ2en6ChoqOkpaanqKmqq6ytrq+wsbKztLW2t7i5uru8vb6/wMHCw8TFxsfIycrLzM3Oz9DR0tPU1dbX2Nna29zd3t/g4eLj5OXm5+jp6uvs7e7v8PHy8/T19vf4+fr7/P3+/w"
                );
  WjTestLib_Assert(iVar3 == 0,"strcmp( string, data3Result) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x67);
  if (iVar3 != 0) {
    string._4_4_ = WJTL_STATUS_FAILED;
  }
  WjTestLib_Free(__result_7);
  return string._4_4_;
}

Assistant:

static
WJTL_STATUS
    TestBase64Encode
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;

    uint8_t data[] = { 1, 2, 3 };
    char* string = NULL;

    JL_ASSERT_SUCCESS( JlBase64Encode( data, 1, &string ) );
    JL_ASSERT_NOT_NULL( string );
    JL_ASSERT( strcmp( string, "AQ" ) == 0 );
    JlFree( string );  string = NULL;

    JL_ASSERT_SUCCESS( JlBase64Encode( data, 2, &string ) );
    JL_ASSERT_NOT_NULL( string );
    JL_ASSERT( strcmp( string, "AQI" ) == 0 );
    JlFree( string );  string = NULL;

    JL_ASSERT_SUCCESS( JlBase64Encode( data, 3, &string ) );
    JL_ASSERT_NOT_NULL( string );
    JL_ASSERT( strcmp( string, "AQID" ) == 0 );
    JlFree( string );  string = NULL;

    uint8_t data2[256*3];
    for( int i=0; i<256; i++ )
    {
        data2[i*3 + 0] = (uint8_t)i;
        data2[i*3 + 1] = (uint8_t)i;
        data2[i*3 + 2] = (uint8_t)i;
    }
    char const* data2Result =
        "AAAAAQEBAgICAwMDBAQEBQUFBgYGBwcHCAgICQkJCgoKCwsLDAwMDQ0NDg4ODw8P"
        "EBAQEREREhISExMTFBQUFRUVFhYWFxcXGBgYGRkZGhoaGxsbHBwcHR0dHh4eHx8f"
        "ICAgISEhIiIiIyMjJCQkJSUlJiYmJycnKCgoKSkpKioqKysrLCwsLS0tLi4uLy8v"
        "MDAwMTExMjIyMzMzNDQ0NTU1NjY2Nzc3ODg4OTk5Ojo6Ozs7PDw8PT09Pj4+Pz8/"
        "QEBAQUFBQkJCQ0NDRERERUVFRkZGR0dHSEhISUlJSkpKS0tLTExMTU1NTk5OT09P"
        "UFBQUVFRUlJSU1NTVFRUVVVVVlZWV1dXWFhYWVlZWlpaW1tbXFxcXV1dXl5eX19f"
        "YGBgYWFhYmJiY2NjZGRkZWVlZmZmZ2dnaGhoaWlpampqa2trbGxsbW1tbm5ub29v"
        "cHBwcXFxcnJyc3NzdHR0dXV1dnZ2d3d3eHh4eXl5enp6e3t7fHx8fX19fn5+f39/"
        "gICAgYGBgoKCg4ODhISEhYWFhoaGh4eHiIiIiYmJioqKi4uLjIyMjY2Njo6Oj4+P"
        "kJCQkZGRkpKSk5OTlJSUlZWVlpaWl5eXmJiYmZmZmpqam5ubnJycnZ2dnp6en5+f"
        "oKCgoaGhoqKio6OjpKSkpaWlpqamp6enqKioqampqqqqq6urrKysra2trq6ur6+v"
        "sLCwsbGxsrKys7OztLS0tbW1tra2t7e3uLi4ubm5urq6u7u7vLy8vb29vr6+v7+/"
        "wMDAwcHBwsLCw8PDxMTExcXFxsbGx8fHyMjIycnJysrKy8vLzMzMzc3Nzs7Oz8/P"
        "0NDQ0dHR0tLS09PT1NTU1dXV1tbW19fX2NjY2dnZ2tra29vb3Nzc3d3d3t7e39/f"
        "4ODg4eHh4uLi4+Pj5OTk5eXl5ubm5+fn6Ojo6enp6urq6+vr7Ozs7e3t7u7u7+/v"
        "8PDw8fHx8vLy8/Pz9PT09fX19vb29/f3+Pj4+fn5+vr6+/v7/Pz8/f39/v7+////";

    JL_ASSERT_SUCCESS( JlBase64Encode( data2, sizeof(data2), &string ) );
    JL_ASSERT_NOT_NULL( string );
    JL_ASSERT( strcmp( string, data2Result) == 0 );

    JlFree( string ); string = NULL;

    uint8_t data3[256];
    for( int i=0; i<256; i++ )
    {
        data3[i] = (uint8_t)i;
    }
    char const* data3Result =
        "AAECAwQFBgcICQoLDA0ODxAREhMUFRYXGBkaGxwdHh8gISIjJCUmJygpKissLS4v"
        "MDEyMzQ1Njc4OTo7PD0+P0BBQkNERUZHSElKS0xNTk9QUVJTVFVWV1hZWltcXV5f"
        "YGFiY2RlZmdoaWprbG1ub3BxcnN0dXZ3eHl6e3x9fn+AgYKDhIWGh4iJiouMjY6P"
        "kJGSk5SVlpeYmZqbnJ2en6ChoqOkpaanqKmqq6ytrq+wsbKztLW2t7i5uru8vb6/"
        "wMHCw8TFxsfIycrLzM3Oz9DR0tPU1dbX2Nna29zd3t/g4eLj5OXm5+jp6uvs7e7v"
        "8PHy8/T19vf4+fr7/P3+/w";

    JL_ASSERT_SUCCESS( JlBase64Encode( data3, sizeof(data3), &string ) );
    JL_ASSERT_NOT_NULL( string );
    JL_ASSERT( strcmp( string, data3Result) == 0 );

    JlFree( string ); string = NULL;

    return TestReturn;
}